

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_8dc4::ARTKeyEncodeDecodeTest_Uint32C00010_Test::
~ARTKeyEncodeDecodeTest_Uint32C00010_Test(ARTKeyEncodeDecodeTest_Uint32C00010_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TEST(ARTKeyEncodeDecodeTest, Uint32C00010) {
  using T = std::uint32_t;
  constexpr auto one = static_cast<T>(1);
  // Check the encoder byte order.
  constexpr std::array<const std::byte, sizeof(T)> ikey{
      static_cast<std::byte>(0x01), static_cast<std::byte>(0x02),
      static_cast<std::byte>(0x03), static_cast<std::byte>(0x04)};
  do_encode_decode_test(static_cast<T>(0x01020304), ikey);
  // round-trip tests.
  do_encode_decode_test(static_cast<T>(0));
  do_encode_decode_test(static_cast<T>(0 + 1));
  do_encode_decode_test(static_cast<T>(0 - 1));
  do_encode_decode_test(std::numeric_limits<T>::min());
  do_encode_decode_test(std::numeric_limits<T>::max());
  do_encode_decode_test(std::numeric_limits<T>::min() + one);
  do_encode_decode_test(std::numeric_limits<T>::max() - one);
  // check lexicographic ordering for std::uint32_t pairs.
  do_encode_decode_lt_test(static_cast<T>(0x01020304ULL),
                           static_cast<T>(0x090A0B0CULL));
  do_encode_decode_lt_test(static_cast<T>(0), static_cast<T>(1));
  do_encode_decode_lt_test(static_cast<T>(0x7FFFFFFFULL),
                           static_cast<T>(0x80000000ULL));
  do_encode_decode_lt_test(static_cast<T>(0xFFFFFFFEULL),
                           static_cast<T>(~0ULL));
}